

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::qstring_trait_t>::start_tag_parsing
          (parser_conffile_impl_t<cfgfile::qstring_trait_t> *this,
          lexeme_t<cfgfile::qstring_trait_t> *lexeme,tag_t<cfgfile::qstring_trait_t> *tag)

{
  lexeme_type_t lVar1;
  input_stream_t<cfgfile::qstring_trait_t> *piVar2;
  bool bVar3;
  exception_t<cfgfile::qstring_trait_t> *peVar4;
  allocator<char> local_17b;
  allocator<char> local_17a;
  allocator<char> local_179;
  string_t local_178;
  string_t local_160;
  string_t local_148;
  string_t local_130;
  qstring_wrapper_t local_118;
  qstring_wrapper_t local_100;
  qstring_wrapper_t local_e8;
  string local_d0;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  string local_a8;
  string local_88;
  qstring_wrapper_t local_68;
  qstring_wrapper_t local_50;
  qstring_wrapper_t local_38;
  
  lVar1 = lexeme->m_type;
  if (lVar1 == null) {
    peVar4 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"Unexpected end of file. In file \"",&local_179);
    qstring_trait_t::from_ascii(&local_130,&local_d0);
    operator+(&local_118,&local_130,&((this->m_lex).m_stream)->m_file_name);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"\" on line ",&local_17a)
    ;
    qstring_trait_t::from_ascii(&local_148,&local_88);
    operator+(&local_100,&local_118,&local_148);
    qstring_trait_t::to_string(&local_160,(this->m_lex).m_line_number);
    operator+(&local_e8,&local_100,&local_160);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,".",&local_17b);
    qstring_trait_t::from_ascii(&local_178,&local_a8);
    operator+(&local_68,&local_e8,&local_178);
    exception_t<cfgfile::qstring_trait_t>::exception_t(peVar4,&local_68);
    __cxa_throw(peVar4,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  if (lVar1 != finish) {
    if (lVar1 != start) {
      bVar3 = operator==(&(tag->m_name).m_str,&(lexeme->m_value).m_str);
      if (bVar3) {
        local_d0._M_dataplus._M_p = (pointer)tag;
        std::
        deque<cfgfile::tag_t<cfgfile::qstring_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>*>>
        ::emplace_back<cfgfile::tag_t<cfgfile::qstring_trait_t>*>
                  ((deque<cfgfile::tag_t<cfgfile::qstring_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>*>>
                    *)&(this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack,
                   (tag_t<cfgfile::qstring_trait_t> **)&local_d0);
        piVar2 = (this->m_lex).m_stream;
        local_d0.field_2._8_4_ = (undefined4)(this->m_lex).m_line_number;
        local_d0.field_2._12_4_ = *(undefined4 *)((long)&(this->m_lex).m_line_number + 4);
        uStack_b0 = (undefined4)(this->m_lex).m_column_number;
        uStack_ac = *(undefined4 *)((long)&(this->m_lex).m_column_number + 4);
        local_d0._M_dataplus._M_p = (pointer)(piVar2->m_file_name).m_str.d.d;
        local_d0._M_string_length = (size_type)(piVar2->m_file_name).m_str.d.ptr;
        local_d0.field_2._M_allocated_capacity = (piVar2->m_file_name).m_str.d.size;
        if ((Data *)local_d0._M_dataplus._M_p != (Data *)0x0) {
          LOCK();
          (((Data *)local_d0._M_dataplus._M_p)->super_QArrayData).ref_._q_value =
               (Type)((int)(((Data *)local_d0._M_dataplus._M_p)->super_QArrayData).ref_._q_value + 1
                     );
          UNLOCK();
        }
        (*tag->_vptr_tag_t[5])(tag);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d0);
      }
      return bVar3;
    }
    peVar4 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,
               "Unexpected start curl brace. We expected tag name, but we\'ve got start curl brace. In file \""
               ,&local_179);
    qstring_trait_t::from_ascii(&local_130,&local_d0);
    operator+(&local_118,&local_130,&((this->m_lex).m_stream)->m_file_name);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"\" on line ",&local_17a)
    ;
    qstring_trait_t::from_ascii(&local_148,&local_88);
    operator+(&local_100,&local_118,&local_148);
    qstring_trait_t::to_string(&local_160,(this->m_lex).m_line_number);
    operator+(&local_e8,&local_100,&local_160);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,".",&local_17b);
    qstring_trait_t::from_ascii(&local_178,&local_a8);
    operator+(&local_38,&local_e8,&local_178);
    exception_t<cfgfile::qstring_trait_t>::exception_t(peVar4,&local_38);
    __cxa_throw(peVar4,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  peVar4 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "Unexpected finish curl brace. We expected tag name, but we\'ve got finish curl brace. In file \""
             ,&local_179);
  qstring_trait_t::from_ascii(&local_130,&local_d0);
  operator+(&local_118,&local_130,&((this->m_lex).m_stream)->m_file_name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"\" on line ",&local_17a);
  qstring_trait_t::from_ascii(&local_148,&local_88);
  operator+(&local_100,&local_118,&local_148);
  qstring_trait_t::to_string(&local_160,(this->m_lex).m_line_number);
  operator+(&local_e8,&local_100,&local_160);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,".",&local_17b);
  qstring_trait_t::from_ascii(&local_178,&local_a8);
  operator+(&local_50,&local_e8,&local_178);
  exception_t<cfgfile::qstring_trait_t>::exception_t(peVar4,&local_50);
  __cxa_throw(peVar4,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

bool start_tag_parsing( const lexeme_t< Trait > & lexeme,
		tag_t< Trait > & tag )
	{
		if( lexeme.type() == lexeme_type_t::start )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected start curl brace. "
					"We expected tag name, but we've got start curl brace. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( lexeme.type() == lexeme_type_t::finish )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected finish curl brace. "
					"We expected tag name, but we've got finish curl brace. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( lexeme.type() == lexeme_type_t::null )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( tag.name() == lexeme.value() )
		{
			this->m_stack.push( &tag );

			tag.on_start( parser_info_t< Trait >(
				m_lex.input_stream().file_name(),
				m_lex.line_number(),
				m_lex.column_number() ) );

			return true;
		}

		return false;
	}